

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall HFactor::updateCFT(HFactor *this,HVector *aq,HVector *ep,HighsInt *iRow)

{
  value_type vVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  value_type vVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  size_type sVar22;
  reference pvVar23;
  reference pvVar24;
  reference pvVar25;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  vector<int,_std::allocator<int>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  HighsInt i_put;
  HighsInt i_to;
  HighsInt i_end;
  HighsInt i_from;
  HighsInt new_space;
  HighsInt new_start;
  HighsInt row_count;
  HighsInt row_start;
  HighsInt i_logic_3;
  HighsInt k_4;
  HighsInt u_endX;
  HighsInt u_startX_1;
  HighsInt i_last_1;
  HighsInt i_find_1;
  HighsInt i_logic_2;
  HighsInt k_3;
  HighsInt i_last;
  HighsInt i_find;
  HighsInt i_logic_1;
  HighsInt k_2;
  HighsInt cLogic;
  HighsInt cIndex;
  HighsInt cp_2;
  double value_7;
  HighsInt index_5;
  uint i_6;
  double pivot_multiplier;
  double value_6;
  HighsInt index_4;
  HighsInt k_1;
  double thex;
  HighsInt k;
  double value_5;
  HighsInt kpivot;
  HighsInt pp_2;
  double value_4;
  HighsInt index_3;
  HighsInt i_5;
  double multiplier;
  HighsInt p_row_1;
  HighsInt pp_1;
  HighsInt isort;
  double value_3;
  HighsInt index_2;
  HighsInt i_4;
  double value_2;
  HighsInt index_1;
  uint i_3;
  HighsInt u_startX;
  HighsInt u_countX;
  double ppaq;
  HighsInt i_2;
  HighsInt pf_pp;
  double value_1;
  HighsInt p_row;
  HighsInt pp;
  double value;
  HighsInt index;
  HighsInt i_1;
  HighsInt cp_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> sorted_pp;
  double *t_pivot;
  HighsInt *t_start;
  HighsInt i_logic;
  HighsInt c_row;
  HighsInt cp;
  double *p_alpha;
  double *p_value;
  HighsInt *p_logic;
  HighsInt pf_np0;
  HighsInt i;
  HVector **ep_work;
  HVector **aq_work;
  HVector *vec;
  HighsInt num_update;
  value_type *in_stack_fffffffffffffc48;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc50;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffc58;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffc60;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_02;
  size_type in_stack_fffffffffffffc68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc70;
  int local_1d8;
  int local_1c8;
  int local_1c0;
  int local_1b8;
  int local_1b0;
  int local_1a4;
  uint local_16c;
  int local_154;
  double local_150;
  int local_144;
  double local_140;
  int local_134;
  int local_124;
  int local_10c;
  int local_fc;
  uint local_ec;
  int local_d8;
  double local_d0;
  int local_c0;
  int local_a0;
  int local_9c;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_98;
  void *local_80;
  undefined4 *local_78;
  int local_6c;
  int local_68;
  int local_64;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_60;
  void *local_58;
  void *local_50;
  int local_48;
  int local_44;
  void *local_40;
  void *local_38;
  long local_30;
  int local_24;
  long local_20;
  long local_18;
  long local_10;
  
  local_24 = 0;
  for (local_30 = in_RSI; local_30 != 0; local_30 = *(long *)(local_30 + 0x70)) {
    local_24 = local_24 + 1;
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (long)local_24;
  uVar21 = SUB168(auVar9 * ZEXT816(8),0);
  if (SUB168(auVar9 * ZEXT816(8),8) != 0) {
    uVar21 = 0xffffffffffffffff;
  }
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_38 = operator_new__(uVar21);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (long)local_24;
  uVar21 = SUB168(auVar10 * ZEXT816(8),0);
  if (SUB168(auVar10 * ZEXT816(8),8) != 0) {
    uVar21 = 0xffffffffffffffff;
  }
  local_40 = operator_new__(uVar21);
  for (local_44 = 0; local_44 < local_24; local_44 = local_44 + 1) {
    *(long *)((long)local_38 + (long)local_44 * 8) = local_10;
    *(long *)((long)local_40 + (long)local_44 * 8) = local_18;
    local_10 = *(long *)(local_10 + 0x70);
    local_18 = *(long *)(local_18 + 0x70);
  }
  sVar22 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x668));
  local_48 = (int)sVar22;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (long)local_24;
  uVar21 = SUB168(auVar11 * ZEXT816(4),0);
  if (SUB168(auVar11 * ZEXT816(4),8) != 0) {
    uVar21 = 0xffffffffffffffff;
  }
  local_50 = operator_new__(uVar21);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (long)local_24;
  uVar21 = SUB168(auVar12 * ZEXT816(8),0);
  if (SUB168(auVar12 * ZEXT816(8),8) != 0) {
    uVar21 = 0xffffffffffffffff;
  }
  local_58 = operator_new__(uVar21);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (long)local_24;
  uVar21 = SUB168(auVar13 * ZEXT816(8),0);
  if (SUB168(auVar13 * ZEXT816(8),8) != 0) {
    uVar21 = 0xffffffffffffffff;
  }
  local_60 = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             operator_new__(uVar21);
  for (local_64 = 0; local_64 < local_24; local_64 = local_64 + 1) {
    local_68 = *(int *)(local_20 + (long)local_64 * 4);
    pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x528),(long)local_68);
    local_6c = *pvVar23;
    *(int *)((long)local_50 + (long)local_64 * 4) = local_6c;
    pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x558),(long)local_6c)
    ;
    *(value_type *)((long)local_58 + (long)local_64 * 8) = *pvVar24;
    pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)
                         (*(long *)((long)local_38 + (long)local_64 * 8) + 0x20),(long)local_68);
    (&(local_60->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
      _M_impl.super__Vector_impl_data._M_start)[local_64] = (pointer)*pvVar24;
  }
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (long)(local_24 + 1);
  uVar21 = SUB168(auVar14 * ZEXT816(4),0);
  if (SUB168(auVar14 * ZEXT816(4),8) != 0) {
    uVar21 = 0xffffffffffffffff;
  }
  local_78 = (undefined4 *)operator_new__(uVar21);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (long)local_24;
  uVar21 = SUB168(auVar15 * ZEXT816(8),0);
  if (SUB168(auVar15 * ZEXT816(8),8) != 0) {
    uVar21 = 0xffffffffffffffff;
  }
  local_80 = operator_new__(uVar21);
  sVar22 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8));
  *local_78 = (int)sVar22;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x7d0d39);
  for (local_9c = 0; local_9c < local_24; local_9c = local_9c + 1) {
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x7d0d6c);
    for (local_a0 = 0; local_a0 < *(int *)(*(long *)((long)local_38 + (long)local_9c * 8) + 0x7c);
        local_a0 = local_a0 + 1) {
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)
                           (*(long *)((long)local_38 + (long)local_9c * 8) + 0x80),(long)local_a0);
      iVar6 = *pvVar23;
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           (*(long *)((long)local_38 + (long)local_9c * 8) + 0x98),(long)local_a0);
      vVar1 = *pvVar24;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60._M_current,
                 &(in_stack_fffffffffffffc58._M_current)->first);
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)iVar6);
      *pvVar24 = vVar1;
    }
    for (local_c0 = 0; local_c0 < local_9c; local_c0 = local_c0 + 1) {
      iVar6 = *(int *)(local_20 + (long)local_c0 * 4);
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)iVar6);
      local_d0 = *pvVar24;
      iVar16 = local_c0 + local_48;
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x680),(long)iVar16);
      for (local_d8 = *pvVar23;
          pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x680),
                               (long)(iVar16 + 1)), local_d8 < *pvVar23; local_d8 = local_d8 + 1) {
        pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x698),(long)local_d8);
        pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),
                             (long)*pvVar23);
        dVar2 = *pvVar24;
        pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6b0),
                             (long)local_d8);
        local_d0 = -dVar2 * *pvVar24 + local_d0;
      }
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60._M_current,
                 &(in_stack_fffffffffffffc58._M_current)->first);
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)iVar6);
      *pvVar24 = local_d0;
    }
    pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),
                         (long)*(int *)(local_20 + (long)local_9c * 4));
    dVar2 = *pvVar24;
    pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),
                         (long)*(int *)(local_20 + (long)local_9c * 4));
    *pvVar24 = 0.0;
    local_154 = local_78[local_9c];
    for (local_ec = 0;
        sVar22 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1b0)),
        local_ec < sVar22; local_ec = local_ec + 1) {
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1b0),(ulong)local_ec);
      iVar6 = *pvVar23;
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)iVar6);
      dVar3 = *pvVar24;
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)iVar6);
      *pvVar24 = 0.0;
      if (1e-14 < ABS(dVar3)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60._M_current,
                   &(in_stack_fffffffffffffc58._M_current)->first);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc60._M_current,
                   (value_type_conflict1 *)in_stack_fffffffffffffc58._M_current);
      }
    }
    sVar22 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8));
    local_78[local_9c + 1] = (int)sVar22;
    *(double *)((long)local_80 + (long)local_9c * 8) =
         *(double *)((long)local_58 + (long)local_9c * 8) *
         (double)(&(local_60->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start)[local_9c];
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x7d12de);
    for (local_fc = 0; local_fc < *(int *)(*(long *)((long)local_40 + (long)local_9c * 8) + 0x7c);
        local_fc = local_fc + 1) {
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)
                           (*(long *)((long)local_40 + (long)local_9c * 8) + 0x80),(long)local_fc);
      iVar6 = *pvVar23;
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           (*(long *)((long)local_40 + (long)local_9c * 8) + 0x98),(long)local_fc);
      vVar1 = *pvVar24;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60._M_current,
                 &(in_stack_fffffffffffffc58._M_current)->first);
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)iVar6);
      *pvVar24 = vVar1;
    }
    for (local_10c = 0; local_10c < local_9c; local_10c = local_10c + 1) {
      pvVar25 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          (&local_98,(long)local_10c);
      iVar6 = pvVar25->second;
      iVar16 = *(int *)(local_20 + (long)iVar6 * 4);
      dVar3 = *(double *)((long)local_58 + (long)iVar6 * 8);
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)iVar16)
      ;
      dVar4 = *pvVar24;
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)iVar16)
      ;
      if (1e-14 < ABS(*pvVar24)) {
        for (local_124 = 0; local_124 < *(int *)(*(long *)((long)local_40 + (long)iVar6 * 8) + 0x7c)
            ; local_124 = local_124 + 1) {
          pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (*(long *)((long)local_40 + (long)iVar6 * 8) + 0x80),(long)local_124)
          ;
          iVar17 = *pvVar23;
          pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               (*(long *)((long)local_40 + (long)iVar6 * 8) + 0x98),(long)local_124)
          ;
          dVar5 = *pvVar24;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60._M_current,
                     &(in_stack_fffffffffffffc58._M_current)->first);
          pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),
                               (long)iVar17);
          *pvVar24 = dVar5 * -dVar3 * dVar4 + *pvVar24;
        }
      }
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)iVar16)
      ;
      *pvVar24 = 0.0;
    }
    for (local_134 = 0; local_134 < local_9c; local_134 = local_134 + 1) {
      iVar6 = *(int *)(local_20 + (long)local_134 * 4);
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)iVar6);
      local_140 = *pvVar24;
      for (local_144 = local_78[local_134]; local_144 < (int)local_78[local_134 + 1];
          local_144 = local_144 + 1) {
        pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8),(long)local_144);
        pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),
                             (long)*pvVar23);
        dVar3 = *pvVar24;
        pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5c0),
                             (long)local_144);
        local_140 = -dVar3 * *pvVar24 + local_140;
      }
      dVar3 = *(double *)((long)local_80 + (long)local_134 * 8);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60._M_current,
                 &(in_stack_fffffffffffffc58._M_current)->first);
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)iVar6);
      *pvVar24 = local_140 / dVar3;
    }
    local_150 = 0.0;
    for (; local_154 < (int)sVar22; local_154 = local_154 + 1) {
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8),(long)local_154);
      iVar6 = *pvVar23;
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5c0),
                           (long)local_154);
      dVar3 = *pvVar24;
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)iVar6);
      local_150 = *pvVar24 * dVar3 + local_150;
    }
    *(double *)((long)local_80 + (long)local_9c * 8) =
         local_150 * *(double *)((long)local_58 + (long)local_9c * 8) + dVar2;
    pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),
                         (long)*(int *)(local_20 + (long)local_9c * 4));
    *pvVar24 = 0.0;
    for (local_16c = 0;
        sVar22 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1b0)),
        local_16c < sVar22; local_16c = local_16c + 1) {
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1b0),(ulong)local_16c);
      iVar6 = *pvVar23;
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)iVar6);
      dVar2 = *pvVar24;
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)iVar6);
      *pvVar24 = 0.0;
      if (1e-14 < ABS(dVar2)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60._M_current,
                   &(in_stack_fffffffffffffc58._M_current)->first);
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffffc50,(value_type_conflict1 *)in_stack_fffffffffffffc48);
      }
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60._M_current,
               &(in_stack_fffffffffffffc58._M_current)->first);
    sVar22 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x698));
    pvVar23 = std::vector<int,_std::allocator<int>_>::back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc50);
    *(int *)(in_RDI + 0x574) = *(int *)(in_RDI + 0x574) + ((int)sVar22 - *pvVar23);
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x698));
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc50,
               &in_stack_fffffffffffffc48->first);
    std::make_pair<int&,int&>(&in_stack_fffffffffffffc48->first,(int *)0x7d1bd6);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               in_stack_fffffffffffffc48);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               in_stack_fffffffffffffc48);
    pdqsort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  }
  for (local_1a4 = 0; local_1a4 < local_24; local_1a4 = local_1a4 + 1) {
    iVar6 = *(int *)(local_20 + (long)local_1a4 * 4);
    iVar16 = *(int *)((long)local_50 + (long)local_1a4 * 4);
    pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5f0),(long)iVar16);
    iVar17 = *pvVar23;
    pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5d8),(long)iVar16);
    *(int *)(in_RDI + 0x574) = *(int *)(in_RDI + 0x574) - (iVar17 - *pvVar23);
    pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5d8),(long)iVar16);
    for (local_1b0 = *pvVar23;
        pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5f0),(long)iVar16),
        local_1b0 < *pvVar23; local_1b0 = local_1b0 + 1) {
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x620),(long)local_1b0);
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x528),(long)*pvVar23);
      iVar17 = *pvVar23;
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x578),(long)iVar17);
      local_1b8 = *pvVar23;
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x590),(long)iVar17);
      iVar17 = *pvVar23 + -1;
      *pvVar23 = iVar17;
      while ((local_1b8 <= iVar17 &&
             (pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8),
                                   (long)local_1b8), *pvVar23 != iVar6))) {
        local_1b8 = local_1b8 + 1;
      }
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8),(long)iVar17);
      vVar7 = *pvVar23;
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8),(long)local_1b8);
      *pvVar23 = vVar7;
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5c0),(long)iVar17)
      ;
      vVar1 = *pvVar24;
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5c0),
                           (long)local_1b8);
      *pvVar24 = vVar1;
    }
    pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x590),(long)iVar16);
    iVar17 = *pvVar23;
    pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x578),(long)iVar16);
    *(int *)(in_RDI + 0x574) = *(int *)(in_RDI + 0x574) - (iVar17 - *pvVar23);
    pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x578),(long)iVar16);
    for (local_1c0 = *pvVar23;
        pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x590),(long)iVar16),
        local_1c0 < *pvVar23; local_1c0 = local_1c0 + 1) {
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8),(long)local_1c0);
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x528),(long)*pvVar23);
      iVar17 = *pvVar23;
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5d8),(long)iVar17);
      local_1c8 = *pvVar23;
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5f0),(long)iVar17);
      iVar18 = *pvVar23 + -1;
      *pvVar23 = iVar18;
      while ((local_1c8 <= iVar18 &&
             (pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x620),
                                   (long)local_1c8), *pvVar23 != iVar6))) {
        local_1c8 = local_1c8 + 1;
      }
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x608),(long)iVar17);
      *pvVar23 = *pvVar23 + 1;
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x620),(long)iVar18);
      vVar7 = *pvVar23;
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x620),(long)local_1c8);
      *pvVar23 = vVar7;
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x638),(long)iVar18)
      ;
      vVar1 = *pvVar24;
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x638),
                           (long)local_1c8);
      *pvVar24 = vVar1;
    }
    local_1d8 = local_78[local_1a4];
    iVar17 = local_78[local_1a4 + 1];
    *(int *)(in_RDI + 0x574) = (iVar17 - local_1d8) + *(int *)(in_RDI + 0x574);
    for (; local_1d8 < iVar17; local_1d8 = local_1d8 + 1) {
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8),(long)local_1d8);
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x528),(long)*pvVar23);
      iVar18 = *pvVar23;
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x608),(long)iVar18);
      if (*pvVar23 == 0) {
        pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5d8),(long)iVar18);
        iVar8 = *pvVar23;
        pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5f0),(long)iVar18);
        iVar19 = *pvVar23 - iVar8;
        sVar22 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x620));
        iVar20 = (int)sVar22;
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
                   in_stack_fffffffffffffc68);
        std::vector<double,_std::allocator<double>_>::resize
                  (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x620);
        std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar8);
        std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(iVar8 + iVar19));
        std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar20);
        std::copy<int*,int*>
                  (&(in_stack_fffffffffffffc60._M_current)->first,
                   &(in_stack_fffffffffffffc58._M_current)->first,(int *)in_stack_fffffffffffffc50);
        this_01 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x638);
        std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)iVar8);
        std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)(iVar8 + iVar19));
        std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)iVar20);
        std::copy<double*,double*>
                  ((double *)in_stack_fffffffffffffc60._M_current,
                   (double *)in_stack_fffffffffffffc58._M_current,
                   (double *)in_stack_fffffffffffffc50);
        pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5d8),(long)iVar18);
        *pvVar23 = iVar20;
        pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5f0),(long)iVar18);
        *pvVar23 = iVar20 + iVar19;
        pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x608),(long)iVar18);
        *pvVar23 = (int)((double)iVar19 * 1.1 + 5.0) - iVar19;
      }
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x608),(long)iVar18);
      *pvVar23 = *pvVar23 + -1;
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5f0),(long)iVar18);
      iVar18 = *pvVar23;
      *pvVar23 = iVar18 + 1;
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x620),(long)iVar18);
      *pvVar23 = iVar6;
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5c0),
                           (long)local_1d8);
      vVar1 = *pvVar24;
      pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x638),(long)iVar18)
      ;
      *pvVar24 = vVar1;
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60._M_current,
               &(in_stack_fffffffffffffc58._M_current)->first);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60._M_current,
               &(in_stack_fffffffffffffc58._M_current)->first);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5d8),(long)iVar16);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60._M_current,
               &(in_stack_fffffffffffffc58._M_current)->first);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5d8),(long)iVar16);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60._M_current,
               &(in_stack_fffffffffffffc58._M_current)->first);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x608),(long)iVar16);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5f0),(long)iVar16);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5d8),(long)iVar16);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc50,
               &in_stack_fffffffffffffc48->first);
    sVar22 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x540));
    pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x528),(long)iVar6);
    *pvVar23 = (value_type)sVar22;
    pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x540),(long)iVar16);
    *pvVar23 = -1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60._M_current,
               &(in_stack_fffffffffffffc58._M_current)->first);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc60._M_current,
               (value_type_conflict1 *)in_stack_fffffffffffffc58._M_current);
  }
  if (local_38 != (void *)0x0) {
    operator_delete__(local_38);
  }
  if (local_40 != (void *)0x0) {
    operator_delete__(local_40);
  }
  if (local_50 != (void *)0x0) {
    operator_delete__(local_50);
  }
  if (local_58 != (void *)0x0) {
    operator_delete__(local_58);
  }
  this_02 = local_60;
  if (local_60 != (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0) {
    operator_delete__(local_60);
  }
  if (local_78 != (undefined4 *)0x0) {
    operator_delete__(local_78);
  }
  if (local_80 != (void *)0x0) {
    operator_delete__(local_80);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(this_02);
  return;
}

Assistant:

void HFactor::updateCFT(HVector* aq, HVector* ep, HighsInt* iRow
                        //, HighsInt* hint
) {
  /*
   * In the major update loop, the prefix
   *
   * c(p) = current working pivot
   * p(p) = previous pivot  (0 =< pp < cp)
   */

  HighsInt num_update = 0;
  for (HVector* vec = aq; vec != 0; vec = vec->next) num_update++;

  HVector** aq_work = new HVector*[num_update];
  HVector** ep_work = new HVector*[num_update];

  for (HighsInt i = 0; i < num_update; i++) {
    aq_work[i] = aq;
    ep_work[i] = ep;
    aq = aq->next;
    ep = ep->next;
  }

  // Pivot related buffers
  HighsInt pf_np0 = pf_pivot_index.size();
  HighsInt* p_logic = new HighsInt[num_update];
  double* p_value = new double[num_update];
  double* p_alpha = new double[num_update];
  for (HighsInt cp = 0; cp < num_update; cp++) {
    HighsInt c_row = iRow[cp];
    HighsInt i_logic = u_pivot_lookup[c_row];
    p_logic[cp] = i_logic;
    p_value[cp] = u_pivot_value[i_logic];
    p_alpha[cp] = aq_work[cp]->array[c_row];
  }

  // Temporary U pointers
  HighsInt* t_start = new HighsInt[num_update + 1];
  double* t_pivot = new double[num_update];
  t_start[0] = u_index.size();

  // Logically sorted previous row_ep
  vector<pair<HighsInt, int> > sorted_pp;

  // Major update loop
  for (HighsInt cp = 0; cp < num_update; cp++) {
    // 1. Expand partial FTRAN result to buffer
    iwork.clear();
    for (HighsInt i = 0; i < aq_work[cp]->packCount; i++) {
      HighsInt index = aq_work[cp]->packIndex[i];
      double value = aq_work[cp]->packValue[i];
      iwork.push_back(index);
      dwork[index] = value;
    }

    // 2. Update partial FTRAN result by recent FT matrix
    for (HighsInt pp = 0; pp < cp; pp++) {
      HighsInt p_row = iRow[pp];
      double value = dwork[p_row];
      HighsInt pf_pp = pp + pf_np0;
      for (HighsInt i = pf_start[pf_pp]; i < pf_start[pf_pp + 1]; i++)
        value -= dwork[pf_index[i]] * pf_value[i];
      iwork.push_back(p_row);  // OK to duplicate
      dwork[p_row] = value;
    }

    // 3. Store the partial FTRAN result to matrix U
    double ppaq = dwork[iRow[cp]];  // pivot of the partial aq
    dwork[iRow[cp]] = 0;
    HighsInt u_countX = t_start[cp];
    HighsInt u_startX = u_countX;
    for (unsigned i = 0; i < iwork.size(); i++) {
      HighsInt index = iwork[i];
      double value = dwork[index];
      dwork[index] = 0;  // This effectively removes all duplication
      if (fabs(value) > kHighsTiny) {
        u_index.push_back(index);
        u_value.push_back(value);
      }
    }
    u_countX = u_index.size();
    t_start[cp + 1] = u_countX;
    t_pivot[cp] = p_value[cp] * p_alpha[cp];

    // 4. Expand partial BTRAN result to buffer
    iwork.clear();
    for (HighsInt i = 0; i < ep_work[cp]->packCount; i++) {
      HighsInt index = ep_work[cp]->packIndex[i];
      double value = ep_work[cp]->packValue[i];
      iwork.push_back(index);
      dwork[index] = value;
    }

    // 5. Delete logical later rows (in logical order)
    for (HighsInt isort = 0; isort < cp; isort++) {
      HighsInt pp = sorted_pp[isort].second;
      HighsInt p_row = iRow[pp];
      double multiplier = -p_value[pp] * dwork[p_row];
      if (fabs(dwork[p_row]) > kHighsTiny) {
        for (HighsInt i = 0; i < ep_work[pp]->packCount; i++) {
          HighsInt index = ep_work[pp]->packIndex[i];
          double value = ep_work[pp]->packValue[i];
          iwork.push_back(index);
          dwork[index] += value * multiplier;
        }
      }
      dwork[p_row] = 0;  // Force to be 0
    }

    // 6. Update partial BTRAN result by recent U columns
    for (HighsInt pp = 0; pp < cp; pp++) {
      HighsInt kpivot = iRow[pp];
      double value = dwork[kpivot];
      for (HighsInt k = t_start[pp]; k < t_start[pp + 1]; k++)
        value -= dwork[u_index[k]] * u_value[k];
      value /= t_pivot[pp];
      iwork.push_back(kpivot);
      dwork[kpivot] = value;  // Again OK to duplicate
    }

    // 6.x compute current alpha
    double thex = 0;
    for (HighsInt k = u_startX; k < u_countX; k++) {
      HighsInt index = u_index[k];
      double value = u_value[k];
      thex += dwork[index] * value;
    }
    t_pivot[cp] = ppaq + thex * p_value[cp];

    // 7. Store BTRAN result to FT elimination, update logic helper
    dwork[iRow[cp]] = 0;
    double pivot_multiplier = -p_value[cp];
    for (unsigned i = 0; i < iwork.size(); i++) {
      HighsInt index = iwork[i];
      double value = dwork[index];
      dwork[index] = 0;
      if (fabs(value) > kHighsTiny) {
        pf_index.push_back(index);
        pf_value.push_back(value * pivot_multiplier);
      }
    }
    pf_pivot_index.push_back(iRow[cp]);
    u_total_x += pf_index.size() - pf_start.back();
    pf_start.push_back(pf_index.size());

    // 8. Update the sorted ep
    sorted_pp.push_back(make_pair(p_logic[cp], cp));
    pdqsort(sorted_pp.begin(), sorted_pp.end());
  }

  // Now modify the U matrix
  for (HighsInt cp = 0; cp < num_update; cp++) {
    // 1. Delete pivotal row from U
    HighsInt cIndex = iRow[cp];
    HighsInt cLogic = p_logic[cp];
    u_total_x -= ur_lastp[cLogic] - ur_start[cLogic];
    for (HighsInt k = ur_start[cLogic]; k < ur_lastp[cLogic]; k++) {
      // Find the pivotal position
      HighsInt i_logic = u_pivot_lookup[ur_index[k]];
      HighsInt i_find = u_start[i_logic];
      HighsInt i_last = --u_last_p[i_logic];
      for (; i_find <= i_last; i_find++)
        if (u_index[i_find] == cIndex) break;
      // Put last to find, and delete last
      u_index[i_find] = u_index[i_last];
      u_value[i_find] = u_value[i_last];
    }

    // 2. Delete pivotal column from UR
    u_total_x -= u_last_p[cLogic] - u_start[cLogic];
    for (HighsInt k = u_start[cLogic]; k < u_last_p[cLogic]; k++) {
      // Find the pivotal position
      HighsInt i_logic = u_pivot_lookup[u_index[k]];
      HighsInt i_find = ur_start[i_logic];
      HighsInt i_last = --ur_lastp[i_logic];
      for (; i_find <= i_last; i_find++)
        if (ur_index[i_find] == cIndex) break;
      // Put last to find, and delete last
      ur_space[i_logic]++;
      ur_index[i_find] = ur_index[i_last];
      ur_value[i_find] = ur_value[i_last];
    }

    // 3. Insert the (stored) partial FTRAN to the row matrix
    HighsInt u_startX = t_start[cp];
    HighsInt u_endX = t_start[cp + 1];
    u_total_x += u_endX - u_startX;
    // Store column as UR elements
    for (HighsInt k = u_startX; k < u_endX; k++) {
      // Which ETA file
      HighsInt i_logic = u_pivot_lookup[u_index[k]];

      // Move row to the end if necessary
      if (ur_space[i_logic] == 0) {
        // Make pointers
        HighsInt row_start = ur_start[i_logic];
        HighsInt row_count = ur_lastp[i_logic] - row_start;
        HighsInt new_start = ur_index.size();
        HighsInt new_space = row_count * 1.1 + 5;

        // Check matrix UR
        ur_index.resize(new_start + new_space);
        ur_value.resize(new_start + new_space);

        // Move elements
        HighsInt i_from = row_start;
        HighsInt i_end = row_start + row_count;
        HighsInt i_to = new_start;
        copy(&ur_index[i_from], &ur_index[i_end], &ur_index[i_to]);
        copy(&ur_value[i_from], &ur_value[i_end], &ur_value[i_to]);

        // Save new pointers
        ur_start[i_logic] = new_start;
        ur_lastp[i_logic] = new_start + row_count;
        ur_space[i_logic] = new_space - row_count;
      }

      // Put into the next available space
      ur_space[i_logic]--;
      HighsInt i_put = ur_lastp[i_logic]++;
      ur_index[i_put] = cIndex;
      ur_value[i_put] = u_value[k];
    }

    // 4. Save pointers
    u_start.push_back(u_startX);
    u_last_p.push_back(u_endX);

    ur_start.push_back(ur_start[cLogic]);
    ur_lastp.push_back(ur_start[cLogic]);
    ur_space.push_back(ur_space[cLogic] + ur_lastp[cLogic] - ur_start[cLogic]);

    u_pivot_lookup[cIndex] = u_pivot_index.size();
    u_pivot_index[cLogic] = -1;
    u_pivot_index.push_back(cIndex);
    u_pivot_value.push_back(t_pivot[cp]);
  }

  //    // See if we want refactor
  //    if (u_total_x > u_merit_x && pf_pivot_index.size() > 100)
  //        *hint = 1;
  delete[] aq_work;
  delete[] ep_work;
  delete[] p_logic;
  delete[] p_value;
  delete[] p_alpha;
  delete[] t_start;
  delete[] t_pivot;
}